

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialAnalyzer.cpp
# Opt level: O0

void __thiscall
OpenMD::SequentialAnalyzer::SequentialAnalyzer
          (SequentialAnalyzer *this,SimInfo *info,string *filename,string *sele1,string *sele2)

{
  bool bVar1;
  undefined1 uVar2;
  string *in_RCX;
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  SimInfo *in_stack_00000008;
  SelectionEvaluator *in_stack_00000010;
  SimInfo *in_stack_000001b8;
  SelectionManager *in_stack_000001c0;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  SelectionManager *in_stack_ffffffffffffff20;
  SelectionEvaluator *this_00;
  string *script;
  SelectionEvaluator *this_01;
  
  *in_RDI = &PTR__SequentialAnalyzer_00394c38;
  in_RDI[1] = in_RSI;
  in_RDI[2] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 3),in_RDX);
  SelectionManager::SelectionManager(in_stack_000001c0,in_stack_000001b8);
  std::__cxx11::string::string((string *)(in_RDI + 0x20),in_RCX);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000010,in_stack_00000008);
  SelectionManager::SelectionManager(in_stack_000001c0,in_stack_000001b8);
  this_01 = (SelectionEvaluator *)(in_RDI + 0xe7);
  std::__cxx11::string::string((string *)this_01,in_R8);
  script = (string *)(in_RDI + 0xeb);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000010,in_stack_00000008);
  *(undefined4 *)(in_RDI + 0x195) = 1;
  std::__cxx11::string::string((string *)(in_RDI + 0x196));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x13e061);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x13e07a);
  this_00 = (SelectionEvaluator *)(in_RDI + 0x1a1);
  std::__cxx11::string::string((string *)this_00);
  std::__cxx11::string::string((string *)(in_RDI + 0x1a5));
  std::__cxx11::string::clear();
  SelectionEvaluator::loadScriptString(this_01,script);
  SelectionEvaluator::loadScriptString(this_01,script);
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x24));
  if (!bVar1) {
    in_stack_ffffffffffffff20 = (SelectionManager *)(in_RDI + 7);
    SelectionEvaluator::evaluate(this_00);
    SelectionManager::setSelectionSet
              (in_stack_ffffffffffffff20,
               (SelectionSet *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    SelectionSet::~SelectionSet((SelectionSet *)0x13e169);
  }
  uVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xeb));
  if (!(bool)uVar2) {
    SelectionEvaluator::evaluate(this_00);
    SelectionManager::setSelectionSet
              (in_stack_ffffffffffffff20,(SelectionSet *)CONCAT17(uVar2,in_stack_ffffffffffffff18));
    SelectionSet::~SelectionSet((SelectionSet *)0x13e2b4);
  }
  return;
}

Assistant:

SequentialAnalyzer::SequentialAnalyzer(SimInfo* info,
                                         const std::string& filename,
                                         const std::string& sele1,
                                         const std::string& sele2) :
      info_(info),
      currentSnapshot_(NULL), dumpFilename_(filename), seleMan1_(info),
      selectionScript1_(sele1), evaluator1_(info), seleMan2_(info),
      selectionScript2_(sele2), evaluator2_(info), step_(1) {
    paramString_.clear();

    evaluator1_.loadScriptString(selectionScript1_);
    evaluator2_.loadScriptString(selectionScript2_);

    // if selections are static, we only need to evaluate them once
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }
  }